

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point-to-point.hpp
# Opt level: O0

status * diy::mpi::detail::recv<char>
                   (DIY_MPI_Comm comm,int source,int tag,vector<char,_std::allocator<char>_> *x)

{
  int in_ECX;
  uint in_EDX;
  void *in_RSI;
  status *in_RDI;
  status s;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  status *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  DIY_MPI_Comm in_stack_ffffffffffffffa0;
  
  probe(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  status::count<char>(in_stack_ffffffffffffff80);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffffa0.data,
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  address<std::vector<char,std::allocator<char>>>((vector<char,_std::allocator<char>_> *)0x167fd2);
  count<std::vector<char,std::allocator<char>>>((vector<char,_std::allocator<char>_> *)0x167fe1);
  datatype_of<std::vector<char,std::allocator<char>>>(in_stack_ffffffffffffff78);
  recv((int)in_RDI,in_RSI,(ulong)in_EDX,in_ECX);
  return in_RDI;
}

Assistant:

status recv(DIY_MPI_Comm comm, int source, int tag, std::vector<T>& x)
  {
    auto s = probe(comm, source, tag);
    x.resize(static_cast<size_t>(s.count<T>()));
    return recv(comm, source, tag, address(x), count(x), datatype_of(x));
  }